

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_array.cpp
# Opt level: O0

void __thiscall JsonArray_Nested_Test::~JsonArray_Nested_Test(JsonArray_Nested_Test *this)

{
  JsonArray_Nested_Test *this_local;
  
  ~JsonArray_Nested_Test(this);
  operator_delete(this,0x338);
  return;
}

Assistant:

TEST_F (JsonArray, Nested) {
    {
        ::testing::InSequence _;
        EXPECT_CALL (callbacks_, begin_array ()).Times (2);
        EXPECT_CALL (callbacks_, null_value ()).Times (1);
        EXPECT_CALL (callbacks_, end_array ()).Times (2);
    }
    auto p = json::make_parser (proxy_);
    p.input ("[[null]]"s).eof ();
    EXPECT_FALSE (p.has_error ());
}